

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::anon_unknown_26::step<double>(double start,double direction,uint64_t steps)

{
  undefined8 local_28;
  uint64_t i;
  uint64_t steps_local;
  double direction_local;
  double start_local;
  
  direction_local = start;
  for (local_28 = 0; local_28 < steps; local_28 = local_28 + 1) {
    direction_local = nextafter(direction_local,direction);
  }
  return direction_local;
}

Assistant:

FP step(FP start, FP direction, uint64_t steps) {
    for (uint64_t i = 0; i < steps; ++i) {
#if defined(CATCH_CONFIG_GLOBAL_NEXTAFTER)
        start = Catch::nextafter(start, direction);
#else
        start = std::nextafter(start, direction);
#endif
    }
    return start;
}